

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  LogDestination *this;
  bool local_2d;
  MutexLock local_20;
  MutexLock l;
  char *base_filename_local;
  LogSeverity severity_local;
  
  local_2d = 3 < (uint)severity;
  l.mu_ = (Mutex *)base_filename;
  if (local_2d) {
    __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x259,
                  "static void google::LogDestination::SetLogDestination(LogSeverity, const char *)"
                 );
  }
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_20,(Mutex *)log_mutex);
  this = log_destination(severity);
  anon_unknown_10::LogFileObject::SetBasename(&this->fileobject_,(char *)l.mu_);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}